

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

int Dtc_ObjComputeTruth(Gia_Man_t *p,int iObj,int *pCut,int *pTruth)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int local_44;
  uint uStack_40;
  int i;
  uint Truths [3];
  uint Truth;
  int *pTruth_local;
  int *pCut_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  stack0xffffffffffffffd0 = (uint *)pTruth;
  _uStack_40 = 0xcc000000aa;
  Truths[0] = 0xf0;
  for (local_44 = 1; local_44 <= *pCut; local_44 = local_44 + 1) {
    uVar1 = (&uStack_40)[local_44 + -1];
    pGVar2 = Gia_ManObj(p,pCut[local_44]);
    pGVar2->Value = uVar1;
  }
  pGVar2 = Gia_ManObj(p,iObj);
  uVar1 = Dtc_ObjComputeTruth_rec(pGVar2);
  Truths[1] = uVar1 & 0xff;
  pGVar2 = Gia_ManObj(p,iObj);
  Dtc_ObjCleanTruth_rec(pGVar2);
  if (stack0xffffffffffffffd0 != (uint *)0x0) {
    *stack0xffffffffffffffd0 = Truths[1];
  }
  if ((Truths[1] == 0x66) || (Truths[1] == 0x99)) {
    p_local._4_4_ = 3;
  }
  else if ((Truths[1] == 0x96) || (Truths[1] == 0x69)) {
    p_local._4_4_ = 1;
  }
  else if ((((((Truths[1] == 0xe8) || (Truths[1] == 0xd4)) || (Truths[1] == 0xb2)) ||
            ((Truths[1] == 0x71 || (Truths[1] == 0x17)))) || (Truths[1] == 0x2b)) ||
          ((Truths[1] == 0x4d || (Truths[1] == 0x8e)))) {
    p_local._4_4_ = 2;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Dtc_ObjComputeTruth( Gia_Man_t * p, int iObj, int * pCut, int * pTruth )
{
    unsigned Truth, Truths[3] = { 0xAA, 0xCC, 0xF0 }; int i;
    for ( i = 1; i <= pCut[0]; i++ )
        Gia_ManObj(p, pCut[i])->Value = Truths[i-1];
    Truth = 0xFF & Dtc_ObjComputeTruth_rec( Gia_ManObj(p, iObj) );
    Dtc_ObjCleanTruth_rec( Gia_ManObj(p, iObj) );
    if ( pTruth ) 
        *pTruth = Truth;
    if ( Truth == 0x66 || Truth == 0x99 )
        return 3;
    if ( Truth == 0x96 || Truth == 0x69 )
        return 1;
    if ( Truth == 0xE8 || Truth == 0xD4 || Truth == 0xB2 || Truth == 0x71 ||
         Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x8E )
        return 2;
    return 0;
}